

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
pugi::impl::(anonymous_namespace)::as_wide_impl_abi_cxx11_
          (_anonymous_namespace_ *this,char *str,size_t size)

{
  value_type vVar1;
  long lVar2;
  value_type puVar3;
  value_type end;
  value_type begin;
  size_t length;
  uint8_t *data;
  size_t size_local;
  char *str_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  
  vVar1 = anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_counter>
                    (str,size,0);
  std::__cxx11::wstring::wstring((wstring *)this);
  std::__cxx11::wstring::resize((ulong)this);
  if (vVar1 != 0) {
    lVar2 = std::__cxx11::wstring::operator[]((ulong)this);
    puVar3 = anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                       (str,size,lVar2);
    if ((value_type)(lVar2 + vVar1 * 4) != puVar3) {
      __assert_fail("begin + length == end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x91a,
                    "std::basic_string<wchar_t> pugi::impl::(anonymous namespace)::as_wide_impl(const char *, size_t)"
                   );
    }
  }
  return this;
}

Assistant:

PUGI__FN std::basic_string<wchar_t> as_wide_impl(const char* str, size_t size)
	{
		const uint8_t* data = reinterpret_cast<const uint8_t*>(str);

		// first pass: get length in wchar_t units
		size_t length = utf8_decoder::process(data, size, 0, wchar_counter());

		// allocate resulting string
		std::basic_string<wchar_t> result;
		result.resize(length);

		// second pass: convert to wchar_t
		if (length > 0)
		{
			wchar_writer::value_type begin = reinterpret_cast<wchar_writer::value_type>(&result[0]);
			wchar_writer::value_type end = utf8_decoder::process(data, size, begin, wchar_writer());

			assert(begin + length == end);
			(void)!end;
		}

		return result;
	}